

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APA.h
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::APA::APA(APA *this,APA *param_1)

{
  KINT16 KVar1;
  APA *param_1_local;
  APA *this_local;
  
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase,&param_1->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__APA_0032df58;
  KVar1 = param_1->m_i16Value;
  this->m_ApaUnion = param_1->m_ApaUnion;
  this->m_i16Value = KVar1;
  return;
}

Assistant:

class KDIS_EXPORT APA : public DataTypeBase
{
protected:

    union
    {
        struct
        {
            KUINT16 m_ui16APPI    : 14;
            KUINT16 m_ui16Status2 : 1;
            KUINT16 m_ui16Status1 : 1;
        };
        KUINT16 m_ui16ParamIndex;
    }m_ApaUnion;

    KINT16 m_i16Value;

public:

    static const KUINT16 APA_SIZE = 4;

    APA();

    explicit APA(KDataStream &stream) noexcept(false);

    APA( KDIS::DATA_TYPE::ENUMS::AdditionalPassiveParameterIndex APPI, KBOOL Val1, KBOOL Val2, KINT16 Value );

    ~APA() override = default;

    //************************************
    // FullName:    KDIS::DATA_TYPE::APA::SetAPPI
    //              KDIS::DATA_TYPE::APA::GetAPPI
    // Description: Indicates which database record ( or file ) shall be used to describe
    //              an additional acoustic source such as transient effects, pre-launch
    //              data( i.e torpedo tube floodings ), additional sources, and the
    //              states available for each source type. This index shall be used to
    //              identify data from databases such as the Special Event Database
    //              ( SEDB )and an Additional Narrow band Database ( ANDB ).
    // Parameter:   AdditionalPassiveParameterIndex RPM, void
    //************************************
    void SetAPPI( KDIS::DATA_TYPE::ENUMS::AdditionalPassiveParameterIndex APPI );
    KDIS::DATA_TYPE::ENUMS::AdditionalPassiveParameterIndex GetAPPI() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::APA::SetStatus
    //              KDIS::DATA_TYPE::APA::GetStatus
    // Description: The left most 2 bits are used to indicate
    //              on/off/change status of the record.
    //              A value of ( 1, 1 ) shall be used to indicate
    //              the record shall be activated commensurate
    //              with the conditions in the database and the following APA value
    //              field. A value of ( 0, 0 ) shall be used to indicate
    //              that the record has been deselected or turned off.
    //              A value of ( 1, 0 ) shall indicate a state change has occurred.
    //              A value of ( 0, 1 ) shall indicate the state has not
    //              changed, but the corresponding APA value field has changed.
    // Parameter:   KBOOL Val1, void
    // Parameter:   KBOOL Val2
    //************************************
    void SetStatus( KBOOL Val1, KBOOL Val2 );
    KBOOL GetStatusVal1() const;
    KBOOL GetStatusVal2() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::APA::SetValue
    //              KDIS::DATA_TYPE::APA::GetValue
    // Description: Represents the value of a state change
    //              defined in the APA param index field.
    // Parameter:   KINT16 V, void
    //************************************
    void SetValue( KINT16 V );
    KINT16 GetValue() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::APA::GetAsString
    // Description: Returns a string representation
    //************************************
    KString GetAsString() const override;

    //************************************
    // FullName:    KDIS::DATA_TYPE::APA::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    void Decode(KDataStream &stream) noexcept(false) override;

    //************************************
    // FullName:    KDIS::DATA_TYPE::APA::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    KDataStream Encode() const override;

    void Encode(KDataStream &stream) const override;

    KBOOL operator == ( const APA & Value ) const;
    KBOOL operator != ( const APA & Value ) const;
}